

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O1

void Abc_FlowRetime_ConstrainInit(void)

{
  byte *pbVar1;
  void *pvVar2;
  Abc_Obj_t *pAVar3;
  MinRegMan_t *pMVar4;
  uint uVar5;
  int iVar6;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  int iVar9;
  uint cut;
  long lVar10;
  uint uVar11;
  uint cut_00;
  int lag;
  Abc_Obj_t *pOrigObj;
  uint local_54;
  undefined8 *local_50;
  Vec_Int_t *local_48;
  Vec_Int_t *local_40;
  Abc_Obj_t *local_38;
  
  local_50 = (undefined8 *)malloc(0x28);
  *local_50 = 0;
  local_50[1] = 0;
  local_50[2] = 0;
  local_50[3] = 0;
  local_50[4] = 0;
  if (pManMR->pInitNtk == (Abc_Ntk_t *)0x0) {
    __assert_fail("pManMR->pInitNtk",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0x408,"void Abc_FlowRetime_ConstrainInit()");
  }
  if (pManMR->fVerbose != 0) {
    puts("\tsearch for initial state conflict...");
  }
  vNodes = Abc_NtkDfs(pManMR->pInitNtk,0);
  iVar6 = vNodes->nSize;
  pVVar7 = pManMR->pInitNtk->vPis;
  if (0 < pVVar7->nSize) {
    lVar10 = 0;
    do {
      pvVar2 = pVVar7->pArray[lVar10];
      uVar11 = vNodes->nCap;
      if (vNodes->nSize == uVar11) {
        if ((int)uVar11 < 0x10) {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc(0x80);
          }
          else {
            ppvVar8 = (void **)realloc(vNodes->pArray,0x80);
          }
          vNodes->pArray = ppvVar8;
          iVar9 = 0x10;
        }
        else {
          iVar9 = uVar11 * 2;
          if (iVar9 <= (int)uVar11) goto LAB_004d500e;
          if (vNodes->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc((ulong)uVar11 << 4);
          }
          else {
            ppvVar8 = (void **)realloc(vNodes->pArray,(ulong)uVar11 << 4);
          }
          vNodes->pArray = ppvVar8;
        }
        vNodes->nCap = iVar9;
      }
LAB_004d500e:
      iVar9 = vNodes->nSize;
      vNodes->nSize = iVar9 + 1;
      vNodes->pArray[iVar9] = pvVar2;
      lVar10 = lVar10 + 1;
      pVVar7 = pManMR->pInitNtk->vPis;
    } while (lVar10 < pVVar7->nSize);
  }
  if (vNodes->nSize <= iVar6) {
    __assert_fail("nItems < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x347,"void Vec_PtrReorder(Vec_Ptr_t *, int)");
  }
  iVar9 = vNodes->nSize + iVar6;
  if (vNodes->nCap < iVar9) {
    if (vNodes->pArray == (void **)0x0) {
      ppvVar8 = (void **)malloc((long)iVar9 << 3);
    }
    else {
      ppvVar8 = (void **)realloc(vNodes->pArray,(long)iVar9 << 3);
    }
    vNodes->pArray = ppvVar8;
    vNodes->nCap = iVar9;
  }
  memmove(vNodes->pArray + vNodes->nSize,vNodes->pArray,(long)iVar6 * 8);
  memmove(vNodes->pArray,vNodes->pArray + iVar6,(long)vNodes->nSize << 3);
  iVar6 = Abc_FlowRetime_PartialSat(vNodes,0);
  if (iVar6 != 0) {
    __assert_fail("!Abc_FlowRetime_PartialSat( vNodes, 0 )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0x414,"void Abc_FlowRetime_ConstrainInit()");
  }
  local_40 = (Vec_Int_t *)(local_50 + 1);
  local_48 = (Vec_Int_t *)(local_50 + 3);
  do {
    if (pManMR->fVerbose != 0) {
      printf("\t\t");
    }
    uVar11 = vNodes->nSize;
    cut_00 = 0;
    if (uVar11 != 1) {
      cut_00 = 0;
      do {
        cut = (int)(cut_00 + uVar11) >> 1;
        iVar6 = Abc_FlowRetime_PartialSat(vNodes,cut);
        uVar5 = cut;
        if (iVar6 != 0) {
          uVar5 = cut_00;
          uVar11 = cut;
        }
        cut_00 = uVar5;
        if (pManMR->fVerbose != 0) {
          putchar((uint)(iVar6 == 0) * 3 + 0x2a);
        }
        fflush(_stdout);
      } while (cut_00 != uVar11 - 1);
    }
    iVar6 = Abc_FlowRetime_PartialSat(vNodes,uVar11);
    if (iVar6 == 0) {
      __assert_fail("Abc_FlowRetime_PartialSat( vNodes, high )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                    ,0x42b,"void Abc_FlowRetime_ConstrainInit()");
    }
    iVar6 = Abc_FlowRetime_PartialSat(vNodes,cut_00);
    if (iVar6 != 0) {
      __assert_fail("!Abc_FlowRetime_PartialSat( vNodes, low )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                    ,0x42c,"void Abc_FlowRetime_ConstrainInit()");
    }
    if (((int)cut_00 < 0) || (vNodes->nSize <= (int)cut_00)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pAVar3 = (Abc_Obj_t *)vNodes->pArray[cut_00];
    Abc_NtkMarkCone_rec(pAVar3,1);
    if (pManMR->fVerbose != 0) {
      printf("   conflict term = %d ",(ulong)cut_00);
    }
    Abc_FlowRetime_GetInitToOrig(pAVar3,&local_38,(int *)&local_54);
    pAVar3 = local_38;
    if (local_38 == (Abc_Obj_t *)0x0) {
      __assert_fail("pOrigObj",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                    ,0x43e,"void Abc_FlowRetime_ConstrainInit()");
    }
    if (pManMR->fVerbose != 0) {
      printf(" <=> %d/%d\n",(ulong)(uint)local_38->Id,(ulong)local_54);
    }
    Vec_IntPush(local_40,pAVar3->Id);
    Vec_IntPush(local_48,local_54);
    iVar6 = Abc_FlowRetime_PartialSat(vNodes,vNodes->nSize);
  } while (iVar6 != 0);
  *local_50 = 0;
  pVVar7 = pManMR->vInitConstraints;
  uVar11 = pVVar7->nCap;
  if (pVVar7->nSize == uVar11) {
    if ((int)uVar11 < 0x10) {
      if (pVVar7->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc(0x80);
      }
      else {
        ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
      }
      pVVar7->pArray = ppvVar8;
      iVar6 = 0x10;
    }
    else {
      iVar6 = uVar11 * 2;
      if (iVar6 <= (int)uVar11) goto LAB_004d529e;
      if (pVVar7->pArray == (void **)0x0) {
        ppvVar8 = (void **)malloc((ulong)uVar11 << 4);
      }
      else {
        ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar11 << 4);
      }
      pVVar7->pArray = ppvVar8;
    }
    pVVar7->nCap = iVar6;
  }
LAB_004d529e:
  iVar6 = pVVar7->nSize;
  pVVar7->nSize = iVar6 + 1;
  pVVar7->pArray[iVar6] = local_50;
  pMVar4 = pManMR;
  pVVar7 = pManMR->pInitNtk->vObjs;
  if (0 < pVVar7->nSize) {
    lVar10 = 0;
    do {
      if (pVVar7->pArray[lVar10] != (void *)0x0) {
        pbVar1 = (byte *)((long)pVVar7->pArray[lVar10] + 0x14);
        *pbVar1 = *pbVar1 & 0xef;
      }
      lVar10 = lVar10 + 1;
      pVVar7 = pMVar4->pInitNtk->vObjs;
    } while (lVar10 < pVVar7->nSize);
  }
  if (vNodes->pArray != (void **)0x0) {
    free(vNodes->pArray);
    vNodes->pArray = (void **)0x0;
  }
  free(vNodes);
  return;
}

Assistant:

void Abc_FlowRetime_ConstrainInit( ) {
  Vec_Ptr_t *vNodes;
  int low, high, mid;
  int i, n, lag;
  Abc_Obj_t *pObj = NULL, *pOrigObj;
  InitConstraint_t *pConstraint = ABC_ALLOC( InitConstraint_t, 1 );

  memset( pConstraint, 0, sizeof(InitConstraint_t) );

  assert(pManMR->pInitNtk);

  vprintf("\tsearch for initial state conflict...\n");

  vNodes = Abc_NtkDfs(pManMR->pInitNtk, 0);
  n = Vec_PtrSize(vNodes);
  // also add PIs to vNodes
  Abc_NtkForEachPi(pManMR->pInitNtk, pObj, i) 
    Vec_PtrPush(vNodes, pObj);
  Vec_PtrReorder(vNodes, n);

#if defined(DEBUG_CHECK)
    assert(!Abc_FlowRetime_PartialSat( vNodes, 0 ));
#endif

  // grow initialization constraint
  do {
    vprintf("\t\t");

    // find element to add to set...
    low = 0, high = Vec_PtrSize(vNodes);
    while (low != high-1) {
      mid = (low + high) >> 1;
      
      if (!Abc_FlowRetime_PartialSat( vNodes, mid )) {
        low = mid;
        vprintf("-");
      } else {
        high = mid;
        vprintf("*");
      }
      fflush(stdout);
    }
      
#if defined(DEBUG_CHECK)
    assert(Abc_FlowRetime_PartialSat( vNodes, high ));
    assert(!Abc_FlowRetime_PartialSat( vNodes, low ));
#endif
    
    // mark its TFO
    pObj = (Abc_Obj_t*)Vec_PtrEntry( vNodes, low );
    Abc_NtkMarkCone_rec( pObj, 1 );
    vprintf("   conflict term = %d ", low);

#if 0
    printf("init ------\n");
    Abc_ObjPrint(stdout, pObj);
    printf("\n");
    Abc_ObjPrintNeighborhood( pObj, 1 );
    printf("------\n");
#endif

    // add node to constraint
    Abc_FlowRetime_GetInitToOrig( pObj, &pOrigObj, &lag );
    assert(pOrigObj);
    vprintf(" <=> %d/%d\n", Abc_ObjId(pOrigObj), lag);

#if 0    
    printf("orig ------\n");
    Abc_ObjPrint(stdout, pOrigObj);
    printf("\n");
    Abc_ObjPrintNeighborhood( pOrigObj, 1 );
    printf("------\n");
#endif
    Vec_IntPush( &pConstraint->vNodes, Abc_ObjId(pOrigObj) );
    Vec_IntPush( &pConstraint->vLags, lag );

  } while (Abc_FlowRetime_PartialSat( vNodes, Vec_PtrSize(vNodes) ));

  pConstraint->pBiasNode = NULL;

  // add constraint
  Vec_PtrPush( pManMR->vInitConstraints, pConstraint );

  // clear marks
  Abc_NtkForEachObj( pManMR->pInitNtk, pObj, i)
    pObj->fMarkA = 0;

  // free
  Vec_PtrFree( vNodes );
}